

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fluid.cxx
# Opt level: O3

void do_shell_command(Fl_Return_Button *param_1,void *param_2)

{
  uint n;
  int *piVar1;
  Fl_Widget *pFVar2;
  char *pcVar3;
  void *pvVar4;
  
  pFVar2 = (Fl_Widget *)shell_window;
  (*(shell_window->super_Fl_Window).super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget[6])();
  if (s_proc._fpt == (FILE *)0x0) {
    pcVar3 = (shell_command_input->super_Fl_Input_).value_;
    if ((pcVar3 != (char *)0x0) && (*pcVar3 != '\0')) {
      if ((shell_savefl_button->super_Fl_Light_Button).super_Fl_Button.value_ != '\0') {
        param_2 = (void *)0x0;
        save_cb(pFVar2,(void *)0x0);
      }
      if ((shell_writecode_button->super_Fl_Light_Button).super_Fl_Button.value_ != '\0') {
        batch_mode = 1;
        write_cb(pFVar2,param_2);
        batch_mode = 0;
      }
      if ((shell_writemsgs_button->super_Fl_Light_Button).super_Fl_Button.value_ != '\0') {
        batch_mode = 1;
        write_strings_cb(pFVar2,param_2);
        batch_mode = 0;
      }
      Fl_Text_Buffer::text(shell_run_buffer,"");
      Fl_Text_Buffer::insert(shell_run_buffer,shell_run_buffer->mLength,pcVar3);
      Fl_Text_Buffer::insert(shell_run_buffer,shell_run_buffer->mLength,"\n");
      Fl_Window::label(&shell_run_window->super_Fl_Window,"Shell Command Running...");
      s_proc._fpt = (FILE *)popen(pcVar3,"r");
      if ((FILE *)s_proc._fpt != (FILE *)0x0) {
        Fl_Widget::deactivate((Fl_Widget *)shell_run_button);
        Fl_Window::hotspot(&shell_run_window->super_Fl_Window,(Fl_Widget *)shell_run_display,0);
        (*(shell_run_window->super_Fl_Window).super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget[5])();
        n = fileno((FILE *)s_proc._fpt);
        pvVar4 = (void *)(ulong)n;
        Fl::add_fd(n,shell_pipe_cb,(void *)0x0);
        while (s_proc._fpt != (FILE *)0x0) {
          Fl::wait(pvVar4);
        }
        Fl_Widget::activate((Fl_Widget *)shell_run_button);
        Fl_Window::label(&shell_run_window->super_Fl_Window,"Shell Command Complete");
        pvVar4 = (void *)0x0;
        fl_beep(0);
        while ((shell_run_window->super_Fl_Window).i != (Fl_X *)0x0) {
          Fl::wait(pvVar4);
        }
        return;
      }
      piVar1 = __errno_location();
      pcVar3 = strerror(*piVar1);
      fl_alert("Unable to run shell command: %s",pcVar3);
      return;
    }
    pcVar3 = "No shell command entered!";
  }
  else {
    pcVar3 = "Previous shell command still running!";
  }
  fl_alert(pcVar3);
  return;
}

Assistant:

static bool prepare_shell_command(const char * &command)  { // common pre-shell command code all platforms
  shell_window->hide();
  if (s_proc.desc()) {
    fl_alert("Previous shell command still running!");
    return false;
  }
  if ((command = shell_command_input->value()) == NULL || !*command) {
    fl_alert("No shell command entered!");
    return false;
  }
  if (shell_savefl_button->value()) {
    save_cb(0, 0);
  }
  if (shell_writecode_button->value()) {
    batch_mode = 1;
    write_cb(0, 0);
    batch_mode = 0;
  }
  if (shell_writemsgs_button->value()) {
    batch_mode = 1;
    write_strings_cb(0, 0);
    batch_mode = 0;
  }
  return true;
}